

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_front(void)

{
  initializer_list<int> input;
  reference piVar1;
  undefined4 local_64 [2];
  undefined4 local_5c [2];
  undefined4 local_54 [2];
  int local_4c [3];
  iterator local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  local_4c[0] = 0xb;
  local_4c[1] = 0x16;
  local_4c[2] = 0x21;
  local_40 = local_4c;
  local_38 = 3;
  input._M_len = 3;
  input._M_array = local_40;
  vista::circular_view<int,_4UL>::operator=((circular_view<int,_4UL> *)local_30,input);
  piVar1 = vista::circular_view<int,_4UL>::front((circular_view<int,_4UL> *)local_30);
  local_54[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x35d,"void api_fixed_suite::fixed_front()",piVar1,local_54);
  vista::circular_view<int,_4UL>::push_back((circular_view<int,_4UL> *)local_30,0x2c);
  piVar1 = vista::circular_view<int,_4UL>::front((circular_view<int,_4UL> *)local_30);
  local_5c[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x35f,"void api_fixed_suite::fixed_front()",piVar1,local_5c);
  vista::circular_view<int,_4UL>::push_back((circular_view<int,_4UL> *)local_30,0x37);
  piVar1 = vista::circular_view<int,_4UL>::front((circular_view<int,_4UL> *)local_30);
  local_64[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x361,"void api_fixed_suite::fixed_front()",piVar1,local_64);
  return;
}

Assistant:

void fixed_front()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(44);
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(55);
    BOOST_TEST_EQ(span.front(), 22);
}